

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockReader::FilterBlockReader
          (FilterBlockReader *this,FilterPolicy *policy,Slice *contents)

{
  long lVar1;
  char cVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t in_RDX;
  Slice *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  uint32_t last_word;
  size_t n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->data_ = (char *)in_RSI;
  in_RDI->size_ = 0;
  in_RDI[1].data_ = (char *)0x0;
  in_RDI[1].size_ = 0;
  in_RDI[2].data_ = (char *)0x0;
  sVar4 = Slice::size(in_RDI);
  if (4 < sVar4) {
    cVar2 = Slice::operator[](in_RSI,in_RDX);
    in_RDI[2].data_ = (char *)(long)cVar2;
    Slice::data(in_RDI);
    uVar3 = DecodeFixed32((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if ((ulong)uVar3 <= sVar4 - 5) {
      pcVar5 = Slice::data(in_RDI);
      in_RDI->size_ = (size_t)pcVar5;
      in_RDI[1].data_ = (char *)(in_RDI->size_ + (ulong)uVar3);
      in_RDI[1].size_ = (sVar4 - 5) - (ulong)uVar3 >> 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

FilterBlockReader::FilterBlockReader(const FilterPolicy* policy,
                                     const Slice& contents)
    : policy_(policy), data_(nullptr), offset_(nullptr), num_(0), base_lg_(0) {
  size_t n = contents.size();
  if (n < 5) return;  // 1 byte for base_lg_ and 4 for start of offset array
  base_lg_ = contents[n - 1];
  uint32_t last_word = DecodeFixed32(contents.data() + n - 5);
  if (last_word > n - 5) return;
  data_ = contents.data();
  offset_ = data_ + last_word;
  num_ = (n - 5 - last_word) / 4;
}